

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validators.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Option *pOVar1;
  ostream *poVar2;
  ParseError *e;
  string local_638;
  string local_618;
  Validator local_5f8;
  Validator local_590;
  allocator local_521;
  string local_520;
  allocator local_4f9;
  string local_4f8;
  int local_4d8;
  allocator local_4d1;
  int count;
  Validator local_4b0;
  allocator local_441;
  string local_440;
  allocator local_419;
  string local_418;
  undefined1 local_3f8 [8];
  string file;
  string local_3d0;
  allocator local_399;
  string local_398;
  undefined1 local_378 [8];
  App app;
  char **argv_local;
  int argc_local;
  
  app.config_formatter_.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"Validator checker",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3d0,"",(allocator *)(file.field_2._M_local_buf + 0xf));
  CLI::App::App((App *)local_378,&local_398,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)(file.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::__cxx11::string::string((string *)local_3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_418,"-f,--file,file",&local_419);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_440,"File name",&local_441);
  pOVar1 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     ((App *)local_378,&local_418,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8
                      ,&local_440);
  CLI::Validator::Validator(&local_4b0,(Validator *)CLI::ExistingFile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&count,"",&local_4d1);
  CLI::Option::check(pOVar1,&local_4b0,(string *)&count);
  std::__cxx11::string::~string((string *)&count);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  CLI::Validator::~Validator(&local_4b0);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  local_4d8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4f8,"-v,--value",&local_4f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_520,"Value in range",&local_521);
  pOVar1 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     ((App *)local_378,&local_4f8,&local_4d8,&local_520);
  std::__cxx11::string::string((string *)&local_618);
  CLI::Range::Range<int>((Range *)&local_5f8,3,6,&local_618);
  CLI::Validator::Validator(&local_590,&local_5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_638,"",(allocator *)((long)&e + 7));
  CLI::Option::check(pOVar1,&local_590,&local_638);
  std::__cxx11::string::~string((string *)&local_638);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  CLI::Validator::~Validator(&local_590);
  CLI::Range::~Range((Range *)&local_5f8);
  std::__cxx11::string::~string((string *)&local_618);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  CLI::App::parse((App *)local_378,argc,
                  (char **)app.config_formatter_.
                           super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
  poVar2 = std::operator<<((ostream *)&std::cout,"Try printing help or failing the validator");
  std::operator<<(poVar2,'\n');
  std::__cxx11::string::~string((string *)local_3f8);
  CLI::App::~App((App *)local_378);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    CLI::App app("Validator checker");

    std::string file;
    app.add_option("-f,--file,file", file, "File name")->check(CLI::ExistingFile);

    int count{0};
    app.add_option("-v,--value", count, "Value in range")->check(CLI::Range(3, 6));
    CLI11_PARSE(app, argc, argv);

    std::cout << "Try printing help or failing the validator" << '\n';

    return 0;
}